

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ProgramUniformCase::test(ProgramUniformCase *this)

{
  CallLogWrapper *pCVar1;
  TestLog *log;
  char *pcVar2;
  char *__s;
  size_type *psVar3;
  char *pcVar4;
  bool bVar5;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  long *plVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  long lVar10;
  undefined1 auStack_258 [4];
  GLuint local_254;
  GLuint local_250;
  allocator<char> local_249;
  CallLogWrapper *local_248;
  ApiCase *local_240;
  string fragmentSource;
  char *fragmentSourceCStr;
  long local_210;
  long local_208;
  long lStack_200;
  GLuint local_1f4;
  GLint size;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  GLenum type;
  long local_1c0 [2];
  ScopedLogSection local_1b0;
  ostringstream frag;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pCVar1 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b30);
  program = glu::CallLogWrapper::glCreateProgram(pCVar1);
  glu::CallLogWrapper::glAttachShader(pCVar1,program,shader);
  local_254 = program;
  local_250 = shader_00;
  glu::CallLogWrapper::glAttachShader(pCVar1,program,shader_00);
  glu::CallLogWrapper::glShaderSource(pCVar1,shader,1,&test::vertSource,(GLint *)0x0);
  local_248 = pCVar1;
  local_1f4 = shader;
  glu::CallLogWrapper::glCompileShader(pCVar1,shader);
  local_240 = &this->super_ApiCase;
  ApiCase::expectError(&this->super_ApiCase,0);
  lVar10 = 0;
  do {
    log = local_240->m_log;
    pcVar2 = *(char **)((long)&DAT_0077a250 + lVar10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&frag,pcVar2,&local_249);
    _type = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&type,"Verify type of ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&type);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_1e0 = *plVar8;
      lStack_1d8 = plVar6[3];
      _size = &local_1e0;
    }
    else {
      local_1e0 = *plVar8;
      _size = (long *)*plVar6;
    }
    local_1e8 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&size);
    fragmentSourceCStr = (char *)&local_208;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_208 = *plVar8;
      lStack_200 = plVar6[3];
    }
    else {
      local_208 = *plVar8;
      fragmentSourceCStr = (char *)*plVar6;
    }
    local_210 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    __s = *(char **)((long)&PTR_anon_var_dwarf_534c_0077a258 + lVar10);
    plVar6 = (long *)std::__cxx11::string::append((char *)&fragmentSourceCStr);
    fragmentSource._M_dataplus._M_p._0_7_ = SUB87(&fragmentSource.field_2,0);
    fragmentSource._M_dataplus._M_p._7_1_ = (undefined1)((ulong)&fragmentSource.field_2 >> 0x38);
    psVar3 = (size_type *)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if (psVar3 == psVar9) {
      fragmentSource.field_2._M_allocated_capacity = *psVar9;
      fragmentSource.field_2._8_8_ = plVar6[3];
    }
    else {
      fragmentSource._M_dataplus._M_p._0_7_ = SUB87(psVar3,0);
      fragmentSource._M_dataplus._M_p._7_1_ = (undefined1)((ulong)psVar3 >> 0x38);
      fragmentSource.field_2._M_allocated_capacity = *psVar9;
    }
    fragmentSource._M_string_length._0_7_ = (undefined7)plVar6[1];
    fragmentSource._M_string_length._7_1_ = (undefined1)((ulong)plVar6[1] >> 0x38);
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ScopedLogSection::ScopedLogSection(&local_1b0,log,(string *)&frag,&fragmentSource);
    tcu::TestLog::endSection(local_1b0.m_log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT17(fragmentSource._M_dataplus._M_p._7_1_,fragmentSource._M_dataplus._M_p._0_7_) !=
        &fragmentSource.field_2) {
      operator_delete((undefined1 *)
                      CONCAT17(fragmentSource._M_dataplus._M_p._7_1_,
                               fragmentSource._M_dataplus._M_p._0_7_),
                      fragmentSource.field_2._M_allocated_capacity + 1);
    }
    if ((long *)fragmentSourceCStr != &local_208) {
      operator_delete(fragmentSourceCStr,local_208 + 1);
    }
    if (_size != &local_1e0) {
      operator_delete(_size,local_1e0 + 1);
    }
    if (_type != local_1c0) {
      operator_delete(_type,local_1c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_frag != local_198) {
      operator_delete(_frag,local_198[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
    pcVar4 = *(char **)((long)&PTR_anon_var_dwarf_534c_0077a268 + lVar10);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(_frag + -0x18) + 0xb0);
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar4,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"uniform ",8);
    pcVar4 = *(char **)((long)&DAT_0077a260 + lVar10);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(_frag + -0x18) + 0xb0);
    }
    else {
      sVar7 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar4,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(_frag + -0x18) + 0xb0);
    }
    else {
      sVar7 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag," uniformValue",0xd);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(_frag + -0x18) + 0xb0);
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&frag,"\tgl_FragColor = vec4(",0x15);
    pcVar2 = *(char **)((long)&DAT_0077a270 + lVar10);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_258 + (int)*(undefined8 *)(_frag + -0x18) + 0xb0);
    }
    else {
      sVar7 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,");\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
    std::__cxx11::stringbuf::str();
    fragmentSourceCStr =
         (char *)CONCAT17(fragmentSource._M_dataplus._M_p._7_1_,
                          fragmentSource._M_dataplus._M_p._0_7_);
    glu::CallLogWrapper::glShaderSource(local_248,local_250,1,&fragmentSourceCStr,(GLint *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT17(fragmentSource._M_dataplus._M_p._7_1_,fragmentSource._M_dataplus._M_p._0_7_) !=
        &fragmentSource.field_2) {
      operator_delete((undefined1 *)
                      CONCAT17(fragmentSource._M_dataplus._M_p._7_1_,
                               fragmentSource._M_dataplus._M_p._0_7_),
                      fragmentSource.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glCompileShader(local_248,local_250);
    glu::CallLogWrapper::glLinkProgram(local_248,local_254);
    bVar5 = verifyProgramParam((((ApiCase *)&local_240->super_TestCase)->super_TestCase).
                               super_TestCase.super_TestNode.m_testCtx,local_248,local_254,0x8b82,1)
    ;
    if (bVar5) {
      fragmentSource._M_string_length._0_7_ = 0x6f74206e6574;
      fragmentSource._M_dataplus._M_p._0_7_ = 0x69727720746f6e;
      fragmentSource._M_dataplus._M_p._7_1_ = 0x74;
      fragmentSourceCStr = (char *)((ulong)fragmentSourceCStr & 0xffffffff00000000);
      _size = (long *)((ulong)_size & 0xffffffff00000000);
      _type = (long *)((ulong)_type & 0xffffffff00000000);
      glu::CallLogWrapper::glGetActiveUniform
                (local_248,local_254,0,0,(GLsizei *)&fragmentSourceCStr,&size,&type,
                 (GLchar *)&fragmentSource);
      checkIntEquals((((ApiCase *)&local_240->super_TestCase)->super_TestCase).super_TestCase.
                     super_TestNode.m_testCtx,type,*(GLint *)((long)&DAT_0077a278 + lVar10));
      checkIntEquals((((ApiCase *)&local_240->super_TestCase)->super_TestCase).super_TestCase.
                     super_TestNode.m_testCtx,size,*(GLint *)((long)&DAT_0077a27c + lVar10));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
    std::ios_base::~ios_base(local_138);
    pCVar1 = local_248;
    lVar10 = lVar10 + 0x38;
  } while (lVar10 != 0x3f0);
  glu::CallLogWrapper::glDeleteShader(local_248,local_1f4);
  glu::CallLogWrapper::glDeleteShader(pCVar1,local_250);
  glu::CallLogWrapper::glDeleteProgram(pCVar1,local_254);
  ApiCase::expectError(local_240,0);
  return;
}

Assistant:

void test (void)
	{
		const struct UniformType
		{
			const char* declaration;
			const char* postDeclaration;
			const char* precision;
			const char* layout;
			const char* getter;
			GLenum		type;
			GLint		size;
			GLint		isRowMajor;
		} uniformTypes[] =
		{
			{ "float",					"",			"highp",	"",				"uniformValue",													GL_FLOAT,							1, GL_FALSE },
			{ "float",					"[2]",		"highp",	"",				"uniformValue[1]",												GL_FLOAT,							2, GL_FALSE },
			{ "vec2",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC2,						1, GL_FALSE },
			{ "vec3",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC3,						1, GL_FALSE },
			{ "vec4",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC4,						1, GL_FALSE },
			{ "int",					"",			"highp",	"",				"float(uniformValue)",											GL_INT,								1, GL_FALSE },
			{ "ivec2",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC2,						1, GL_FALSE },
			{ "ivec3",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC3,						1, GL_FALSE },
			{ "ivec4",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC4,						1, GL_FALSE },
			{ "bool",					"",			"",			"",				"float(uniformValue)",											GL_BOOL,							1, GL_FALSE },
			{ "bvec2",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC2,						1, GL_FALSE },
			{ "bvec3",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC3,						1, GL_FALSE },
			{ "bvec4",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC4,						1, GL_FALSE },
			{ "mat2",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT2,						1, GL_FALSE },
			{ "mat3",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT3,						1, GL_FALSE },
			{ "mat4",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT4,						1, GL_FALSE },
			{ "sampler2D",				"",			"highp",	"",				"float(texture2D(uniformValue, vec2(0.0, 0.0)).r)",				GL_SAMPLER_2D,						1, GL_FALSE },
			{ "samplerCube",			"",			"highp",	"",				"float(textureCube(uniformValue, vec3(0.0, 0.0, 0.0)).r)",		GL_SAMPLER_CUBE,					1, GL_FALSE },
		};

		static const char* vertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert	= glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag	= glCreateShader(GL_FRAGMENT_SHADER);
		GLuint program		= glCreateProgram();

		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);

		glShaderSource(shaderVert, 1, &vertSource, DE_NULL);
		glCompileShader(shaderVert);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformTypes); ++ndx)
		{
			tcu::ScopedLogSection(m_log, uniformTypes[ndx].declaration, std::string("Verify type of ") + uniformTypes[ndx].declaration + " variable" + uniformTypes[ndx].postDeclaration );

			// gen fragment shader

			std::ostringstream frag;
			frag << uniformTypes[ndx].layout << "uniform " << uniformTypes[ndx].precision << " " << uniformTypes[ndx].declaration << " uniformValue" << uniformTypes[ndx].postDeclaration << ";\n";
			frag << "void main (void)\n";
			frag << "{\n";
			frag << "	gl_FragColor = vec4(" << uniformTypes[ndx].getter << ");\n";
			frag << "}\n";

			{
				std::string fragmentSource = frag.str();
				const char* fragmentSourceCStr = fragmentSource.c_str();
				glShaderSource(shaderFrag, 1, &fragmentSourceCStr, DE_NULL);
			}

			// compile & link

			glCompileShader(shaderFrag);
			glLinkProgram(program);

			// test
			if (verifyProgramParam(m_testCtx, *this, program, GL_LINK_STATUS, GL_TRUE))
			{
				const GLint index = 0; // first and only active uniform

				char buffer[]	= "not written to"; // not written to
				GLint written	= 0;
				GLint size		= 0;
				GLenum type		= 0;
				glGetActiveUniform(program, index, 0, &written, &size, &type, buffer);

				checkIntEquals(m_testCtx, type, uniformTypes[ndx].type);
				checkIntEquals(m_testCtx, size, uniformTypes[ndx].size);
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}